

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawList *this;
  float *pfVar2;
  ImVector<ImGuiWindow_*> *this_00;
  ImVector<ImGuiPopupRef> *this_01;
  ImGuiID IVar3;
  ImFontAtlas *pIVar4;
  ImGuiWindow *pIVar5;
  value_type pIVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  byte bVar9;
  int i;
  int iVar10;
  value_type *ppIVar11;
  ImGuiTextBuffer *this_02;
  char *pcVar12;
  ImGuiIniData *pIVar13;
  ImGuiWindow *pIVar14;
  value_type *ppIVar15;
  value_type *pvVar16;
  char cVar17;
  ulong uVar18;
  ImGuiID IVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  ImGuiWindow **ppIVar23;
  char *pcVar24;
  int m;
  int i_00;
  char *pcVar25;
  ImGuiWindow **ppIVar26;
  int i_1;
  bool bVar27;
  uint uVar28;
  uint uVar29;
  ImVec2 IVar30;
  ImVec2 IVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  ImGuiWindow *in_stack_ffffffffffffff58;
  float y;
  ImGuiIniData *local_98;
  int local_90;
  int file_size;
  char *local_88;
  ImGuiContext *local_80;
  char name [64];
  
  pIVar7 = GImGui;
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x818,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x819,"void ImGui::NewFrame()");
  }
  pIVar4 = (GImGui->IO).Fonts;
  if ((pIVar4->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81a,"void ImGui::NewFrame()");
  }
  ppIVar11 = ImVector<ImFont_*>::operator[](&pIVar4->Fonts,0);
  pIVar8 = GImGui;
  if ((*ppIVar11)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81b,"void ImGui::NewFrame()");
  }
  if ((pIVar7->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x81c,"void ImGui::NewFrame()");
  }
  if (pIVar7->Initialized == false) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    this_02 = (ImGuiTextBuffer *)(*(pIVar8->IO).MemAllocFn)(0x10);
    pIVar7->LogClipboard = this_02;
    ImGuiTextBuffer::ImGuiTextBuffer(this_02);
    if ((pIVar7->Settings).Size != 0) {
      __assert_fail("g.Settings.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x824,"void ImGui::NewFrame()");
    }
    local_80 = GImGui;
    pcVar12 = (GImGui->IO).IniFilename;
    if ((pcVar12 != (char *)0x0) &&
       (pcVar12 = (char *)ImLoadFileToMemory(pcVar12,"rb",&file_size,1), pcVar12 != (char *)0x0)) {
      pcVar24 = pcVar12 + file_size;
      pIVar13 = (ImGuiIniData *)0x0;
      local_88 = pcVar12;
      while (pIVar8 = GImGui, pcVar12 < pcVar24) {
        uVar18 = 0xfffffffffffffffe;
        for (pcVar25 = pcVar12; ((pcVar25 < pcVar24 && (*pcVar25 != '\n')) && (*pcVar25 != '\r'));
            pcVar25 = pcVar25 + 1) {
          uVar18 = (ulong)((int)uVar18 + 1);
        }
        if (((pcVar12 < pcVar25) && (*pcVar12 == '[')) && (pcVar25[-1] == ']')) {
          ImFormatString(name,0x40,"%.*s",uVar18,pcVar12 + 1);
          pIVar13 = FindWindowSettings(name);
          if (pIVar13 == (ImGuiIniData *)0x0) {
            pIVar13 = AddWindowSettings(name);
          }
        }
        else if (pIVar13 == (ImGuiIniData *)0x0) {
          pIVar13 = (ImGuiIniData *)0x0;
        }
        else {
          local_98 = pIVar13;
          iVar10 = __isoc99_sscanf(pcVar12,"Pos=%f,%f",name,&y);
          if (iVar10 == 2) {
            (local_98->Pos).x = (float)name._0_4_;
            (local_98->Pos).y = y;
            pIVar13 = local_98;
          }
          else {
            iVar10 = __isoc99_sscanf(pcVar12,"Size=%f,%f",name,&y);
            if (iVar10 == 2) {
              IVar30 = (local_80->Style).WindowMinSize;
              fVar34 = IVar30.x;
              fVar37 = IVar30.y;
              uVar28 = -(uint)(fVar34 <= (float)name._0_4_);
              uVar29 = -(uint)(fVar37 <= y);
              local_98->Size =
                   (ImVec2)(CONCAT44(~uVar29 & (uint)fVar37,~uVar28 & (uint)fVar34) |
                           CONCAT44((uint)y & uVar29,name._0_4_ & uVar28));
              pIVar13 = local_98;
            }
            else {
              iVar10 = __isoc99_sscanf(pcVar12,"Collapsed=%d",&local_90);
              pIVar13 = local_98;
              if (iVar10 == 1) {
                local_98->Collapsed = local_90 != 0;
              }
            }
          }
        }
        pcVar12 = pcVar25 + 1;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar8->IO).MemFreeFn)(local_88);
    }
    pIVar7->Initialized = true;
  }
  ppIVar11 = ImVector<ImFont_*>::operator[](&((pIVar7->IO).Fonts)->Fonts,0);
  SetCurrentFont(*ppIVar11);
  pIVar7->Time = (pIVar7->IO).DeltaTime + pIVar7->Time;
  pIVar7->FrameCount = pIVar7->FrameCount + 1;
  pIVar7->Tooltip[0] = '\0';
  this = &pIVar7->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,&((pIVar7->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar7->RenderDrawData).Valid = false;
  (pIVar7->RenderDrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar7->RenderDrawData).CmdListsCount = 0;
  (pIVar7->RenderDrawData).TotalVtxCount = 0;
  (pIVar7->RenderDrawData).TotalIdxCount = 0;
  fVar34 = (pIVar7->IO).MousePos.x;
  if ((0.0 <= fVar34) || (pfVar2 = &(pIVar7->IO).MousePos.y, 0.0 < *pfVar2 || *pfVar2 == 0.0)) {
    if (fVar34 < 0.0) goto LAB_00119569;
LAB_00119572:
    IVar30 = (pIVar7->IO).MousePosPrev;
    fVar37 = IVar30.x;
    fVar35 = IVar30.y;
    if ((fVar37 < 0.0) && (fVar35 < 0.0)) goto LAB_0011958e;
    IVar30.x = fVar34 - fVar37;
    IVar30.y = (pIVar7->IO).MousePos.y - fVar35;
    (pIVar7->IO).MouseDelta = IVar30;
  }
  else {
    (pIVar7->IO).MousePos.x = -9999.0;
    (pIVar7->IO).MousePos.y = -9999.0;
    fVar34 = -9999.0;
LAB_00119569:
    pfVar2 = &(pIVar7->IO).MousePos.y;
    if (0.0 < *pfVar2 || *pfVar2 == 0.0) goto LAB_00119572;
LAB_0011958e:
    (pIVar7->IO).MouseDelta.x = 0.0;
    (pIVar7->IO).MouseDelta.y = 0.0;
  }
  IVar30 = (pIVar7->IO).MousePos;
  (pIVar7->IO).MousePosPrev = IVar30;
  for (lVar20 = 0; lVar20 != 5; lVar20 = lVar20 + 1) {
    if ((pIVar7->IO).MouseDown[lVar20] == true) {
      fVar34 = (pIVar7->IO).MouseDownDuration[lVar20];
      (pIVar7->IO).MouseClicked[lVar20] = fVar34 < 0.0;
      (pIVar7->IO).MouseReleased[lVar20] = false;
      (pIVar7->IO).MouseDownDurationPrev[lVar20] = fVar34;
      if (0.0 <= fVar34) {
        (pIVar7->IO).MouseDownDuration[lVar20] = fVar34 + (pIVar7->IO).DeltaTime;
        (pIVar7->IO).MouseDoubleClicked[lVar20] = false;
        fVar34 = (pIVar7->IO).MouseDragMaxDistanceSqr[lVar20];
        fVar37 = IVar30.x - (pIVar7->IO).MouseClickedPos[lVar20].x;
        fVar35 = IVar30.y - (pIVar7->IO).MouseClickedPos[lVar20].y;
        fVar37 = fVar37 * fVar37 + fVar35 * fVar35;
        uVar28 = -(uint)(fVar37 <= fVar34);
        (pIVar7->IO).MouseDragMaxDistanceSqr[lVar20] =
             (float)(uVar28 & (uint)fVar34 | ~uVar28 & (uint)fVar37);
      }
      else {
        (pIVar7->IO).MouseDownDuration[lVar20] = 0.0;
        (pIVar7->IO).MouseDoubleClicked[lVar20] = false;
        fVar34 = pIVar7->Time;
        if ((fVar34 - (pIVar7->IO).MouseClickedTime[lVar20] < (pIVar7->IO).MouseDoubleClickTime) &&
           (fVar35 = IVar30.x - (pIVar7->IO).MouseClickedPos[lVar20].x,
           fVar36 = IVar30.y - (pIVar7->IO).MouseClickedPos[lVar20].y,
           fVar37 = (pIVar7->IO).MouseDoubleClickMaxDist, fVar34 = -3.4028235e+38,
           fVar35 * fVar35 + fVar36 * fVar36 < fVar37 * fVar37)) {
          (pIVar7->IO).MouseDoubleClicked[lVar20] = true;
          fVar34 = -3.4028235e+38;
        }
        (pIVar7->IO).MouseClickedTime[lVar20] = fVar34;
        (pIVar7->IO).MouseClickedPos[lVar20] = IVar30;
        (pIVar7->IO).MouseDragMaxDistanceSqr[lVar20] = 0.0;
      }
    }
    else {
      (pIVar7->IO).MouseClicked[lVar20] = false;
      fVar34 = (pIVar7->IO).MouseDownDuration[lVar20];
      (pIVar7->IO).MouseReleased[lVar20] = 0.0 <= fVar34;
      (pIVar7->IO).MouseDownDurationPrev[lVar20] = fVar34;
      (pIVar7->IO).MouseDownDuration[lVar20] = -1.0;
      (pIVar7->IO).MouseDoubleClicked[lVar20] = false;
    }
  }
  pfVar2 = (pIVar7->IO).KeysDownDuration;
  memcpy((pIVar7->IO).KeysDownDurationPrev,pfVar2,0x800);
  for (lVar20 = 0; lVar20 != 0x200; lVar20 = lVar20 + 1) {
    fVar34 = -1.0;
    if ((pIVar7->IO).KeysDown[lVar20] == true) {
      fVar34 = 0.0;
      if (0.0 <= pfVar2[lVar20]) {
        fVar34 = pfVar2[lVar20] + (pIVar7->IO).DeltaTime;
      }
    }
    pfVar2[lVar20] = fVar34;
  }
  fVar34 = (pIVar7->IO).DeltaTime;
  iVar10 = pIVar7->FramerateSecPerFrameIdx;
  pIVar7->FramerateSecPerFrameAccum =
       (fVar34 - pIVar7->FramerateSecPerFrame[iVar10]) + pIVar7->FramerateSecPerFrameAccum;
  pIVar7->FramerateSecPerFrame[iVar10] = fVar34;
  pIVar7->FramerateSecPerFrameIdx = (iVar10 + 1) % 0x78;
  (pIVar7->IO).Framerate = 1.0 / (pIVar7->FramerateSecPerFrameAccum / 120.0);
  pIVar7->HoveredIdPreviousFrame = pIVar7->HoveredId;
  pIVar7->HoveredId = 0;
  pIVar7->HoveredIdAllowOverlap = false;
  pIVar8 = GImGui;
  if ((pIVar7->ActiveIdIsAlive == false) &&
     (pIVar7->ActiveId != 0 && pIVar7->ActiveIdPreviousFrame == pIVar7->ActiveId)) {
    GImGui->ActiveId = 0;
    pIVar8->ActiveIdIsJustActivated = true;
    pIVar8->ActiveIdAllowOverlap = false;
    pIVar8->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar3 = pIVar7->ActiveId;
  IVar19 = pIVar7->MovedWindowMoveId;
  pIVar7->ActiveIdPreviousFrame = IVar3;
  pIVar7->ActiveIdIsAlive = false;
  pIVar8 = GImGui;
  pIVar7->ActiveIdIsJustActivated = false;
  if (IVar19 == IVar3 && IVar19 != 0) {
    if (GImGui->ActiveId == IVar3) {
      GImGui->ActiveIdIsAlive = true;
    }
    pIVar14 = pIVar7->MovedWindow;
    if ((pIVar14 == (ImGuiWindow *)0x0) || (pIVar14->RootWindow == (ImGuiWindow *)0x0)) {
      __assert_fail("g.MovedWindow && g.MovedWindow->RootWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x872,"void ImGui::NewFrame()");
    }
    if (pIVar14->RootWindow->MoveId != IVar3) {
      __assert_fail("g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0x873,"void ImGui::NewFrame()");
    }
    if ((pIVar7->IO).MouseDown[0] != true) {
      pIVar8->ActiveId = 0;
      pIVar8->ActiveIdIsJustActivated = true;
      pIVar8->ActiveIdAllowOverlap = false;
      pIVar8->ActiveIdWindow = (ImGuiWindow *)0x0;
      goto LAB_00119935;
    }
    if ((((pIVar14->Flags & 4U) == 0) &&
        (IVar30 = (pIVar7->IO).MouseDelta, IVar31.x = (pIVar14->PosFloat).x + IVar30.x,
        IVar31.y = (pIVar14->PosFloat).y + IVar30.y, pIVar14->PosFloat = IVar31,
        ((uint)pIVar14->Flags >> 8 & 1) == 0)) && (pIVar8->SettingsDirtyTimer <= 0.0)) {
      pIVar8->SettingsDirtyTimer = (pIVar8->IO).IniSavingRate;
    }
    FocusWindow(in_stack_ffffffffffffff58);
  }
  else {
LAB_00119935:
    pIVar7->MovedWindow = (ImGuiWindow *)0x0;
    pIVar7->MovedWindowMoveId = 0;
  }
  if ((0.0 < pIVar7->SettingsDirtyTimer) &&
     (fVar34 = pIVar7->SettingsDirtyTimer - (pIVar7->IO).DeltaTime,
     pIVar7->SettingsDirtyTimer = fVar34, fVar34 <= 0.0)) {
    SaveSettings();
  }
  pIVar14 = pIVar7->MovedWindow;
  if (pIVar14 == (ImGuiWindow *)0x0) {
    pIVar14 = FindHoveredWindow((pIVar7->IO).MousePos,false);
    pIVar7->HoveredWindow = pIVar14;
    if (pIVar14 != (ImGuiWindow *)0x0) goto LAB_001199a9;
LAB_001199af:
    pIVar14 = pIVar7->MovedWindow;
    if (pIVar14 != (ImGuiWindow *)0x0) goto LAB_001199bb;
    pIVar14 = FindHoveredWindow((pIVar7->IO).MousePos,true);
  }
  else {
    pIVar7->HoveredWindow = pIVar14;
LAB_001199a9:
    if ((pIVar14->Flags & 0x100000) == 0) goto LAB_001199af;
LAB_001199bb:
    pIVar14 = pIVar14->RootWindow;
  }
  ppIVar26 = &pIVar7->HoveredWindow;
  pIVar7->HoveredRootWindow = pIVar14;
  pIVar14 = GetFrontMostModalRootWindow();
  if (pIVar14 == (ImGuiWindow *)0x0) {
    pIVar7->ModalWindowDarkeningRatio = 0.0;
  }
  else {
    fVar34 = (pIVar7->IO).DeltaTime * 6.0 + pIVar7->ModalWindowDarkeningRatio;
    if (1.0 <= fVar34) {
      fVar34 = 1.0;
    }
    pIVar7->ModalWindowDarkeningRatio = fVar34;
    ppIVar23 = &pIVar7->HoveredRootWindow;
    do {
      pIVar5 = *ppIVar23;
      if (pIVar5 == (ImGuiWindow *)0x0) break;
      ppIVar23 = &pIVar5->ParentWindow;
    } while (pIVar5 != pIVar14);
    if (pIVar5 == (ImGuiWindow *)0x0) {
      *ppIVar26 = (ImGuiWindow *)0x0;
      pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
    }
  }
  uVar18 = 0xffffffffffffffff;
  uVar21 = 0;
  bVar9 = 0;
  while( true ) {
    iVar10 = (int)uVar18;
    if (uVar21 == 5) break;
    if ((pIVar7->IO).MouseClicked[uVar21] == true) {
      bVar27 = true;
      if (*ppIVar26 == (ImGuiWindow *)0x0) {
        bVar27 = (pIVar7->OpenPopupStack).Size != 0;
      }
      (pIVar7->IO).MouseDownOwned[uVar21] = bVar27;
    }
    bVar27 = (pIVar7->IO).MouseDown[uVar21];
    if ((bVar27 == true) &&
       ((iVar10 == -1 ||
        (fVar34 = (pIVar7->IO).MouseClickedTime[iVar10],
        pfVar2 = (pIVar7->IO).MouseClickedTime + uVar21, *pfVar2 <= fVar34 && fVar34 != *pfVar2))))
    {
      uVar18 = uVar21 & 0xffffffff;
    }
    bVar9 = bVar9 & 1 | bVar27;
    uVar21 = uVar21 + 1;
  }
  if (iVar10 == -1) {
    iVar10 = pIVar7->CaptureMouseNextFrame;
    cVar17 = '\x01';
    if (iVar10 != -1) goto LAB_00119ad2;
LAB_00119add:
    cVar17 = '\x01';
    bVar27 = true;
    if (*ppIVar26 == (ImGuiWindow *)0x0 && (bVar9 & 1) == 0) goto LAB_00119aef;
  }
  else {
    cVar17 = (pIVar7->IO).MouseDownOwned[iVar10];
    iVar10 = pIVar7->CaptureMouseNextFrame;
    if (iVar10 != -1) {
LAB_00119ad2:
      (pIVar7->IO).WantCaptureMouse = iVar10 != 0;
      goto LAB_00119b0a;
    }
    if ((bool)cVar17 != false) goto LAB_00119add;
    cVar17 = '\0';
LAB_00119aef:
    bVar27 = true;
    if (pIVar7->ActiveId == 0) {
      bVar27 = (pIVar7->OpenPopupStack).Size != 0;
    }
  }
  (pIVar7->IO).WantCaptureMouse = bVar27;
LAB_00119b0a:
  IVar3 = pIVar7->ActiveId;
  IVar19 = pIVar7->CaptureKeyboardNextFrame;
  if (pIVar7->CaptureKeyboardNextFrame == 0xffffffff) {
    IVar19 = IVar3;
  }
  (pIVar7->IO).WantCaptureKeyboard = IVar19 != 0;
  if (IVar3 == 0) {
    bVar27 = false;
  }
  else {
    bVar27 = (pIVar7->InputTextState).Id == IVar3;
  }
  (pIVar7->IO).WantTextInput = bVar27;
  pIVar7->MouseCursor = 0;
  pIVar7->CaptureMouseNextFrame = -1;
  pIVar7->CaptureKeyboardNextFrame = -1;
  (pIVar7->OsImePosRequest).x = 1.0;
  (pIVar7->OsImePosRequest).y = 1.0;
  if (cVar17 == '\0') {
    pIVar7->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar7->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  else {
    pIVar14 = *ppIVar26;
    if (pIVar14 != (ImGuiWindow *)0x0) {
      fVar34 = (pIVar7->IO).MouseWheel;
      if (((fVar34 != 0.0) || (NAN(fVar34))) && (pIVar14->Collapsed == false)) {
        if ((pIVar7->IO).KeyCtrl == true) {
          if ((pIVar7->IO).FontAllowUserScaling == true) {
            fVar37 = fVar34 * 0.1 + pIVar14->FontWindowScale;
            fVar34 = 2.5;
            if (fVar37 <= 2.5) {
              fVar34 = fVar37;
            }
            fVar34 = (float)(-(uint)(fVar37 < 0.5) & 0x3f000000 |
                            ~-(uint)(fVar37 < 0.5) & (uint)fVar34);
            fVar35 = fVar34 / pIVar14->FontWindowScale;
            pIVar14->FontWindowScale = fVar34;
            fVar34 = 1.0 - fVar35;
            IVar30 = pIVar14->Size;
            auVar33._8_8_ = 0;
            auVar33._0_4_ = IVar30.x;
            auVar33._4_4_ = IVar30.y;
            IVar31 = (pIVar7->IO).MousePos;
            auVar32._0_4_ = (IVar31.x - (pIVar14->Pos).x) * fVar34 * IVar30.x;
            auVar32._4_4_ = (IVar31.y - (pIVar14->Pos).y) * fVar34 * IVar30.y;
            auVar32._8_4_ = fVar34 * 0.0 * 0.0;
            auVar32._12_4_ = fVar34 * 0.0 * 0.0;
            auVar33 = divps(auVar32,auVar33);
            fVar34 = (pIVar14->Pos).x;
            fVar37 = (pIVar14->Pos).y;
            (pIVar14->PosFloat).x = (pIVar14->PosFloat).x + auVar33._0_4_;
            (pIVar14->PosFloat).y = (pIVar14->PosFloat).y + auVar33._4_4_;
            (pIVar14->Pos).x = fVar34 + auVar33._0_4_;
            (pIVar14->Pos).y = fVar37 + auVar33._4_4_;
            fVar34 = (pIVar14->SizeFull).x;
            fVar37 = (pIVar14->SizeFull).y;
            (pIVar14->Size).x = fVar35 * (pIVar14->Size).x;
            (pIVar14->Size).y = fVar35 * (pIVar14->Size).y;
            (pIVar14->SizeFull).x = fVar35 * fVar34;
            (pIVar14->SizeFull).y = fVar35 * fVar37;
          }
        }
        else if ((pIVar14->Flags & 0x10U) == 0) {
          fVar37 = (pIVar14->Scroll).y;
          fVar35 = (pIVar14->DC).CursorMaxPos.y;
          fVar34 = fVar37 - GImGui->FontBaseSize * pIVar14->FontWindowScale * fVar34 *
                            (float)(byte)((((uint)pIVar14->Flags >> 0x17 & 1) == 0) * '\x02' + 3);
          (pIVar14->Scroll).y = fVar34;
          (pIVar14->DC).CursorMaxPos.y = (fVar37 + fVar35) - fVar34;
        }
      }
    }
  }
  if ((((IVar3 == 0) && (pIVar7->FocusedWindow != (ImGuiWindow *)0x0)) &&
      (pIVar7->FocusedWindow->Active == true)) && (bVar27 = IsKeyPressedMap(0,false), bVar27)) {
    pIVar7->FocusedWindow->FocusIdxTabRequestNext = 0;
  }
  this_00 = &pIVar7->Windows;
  for (iVar10 = 0; iVar10 != this_00->Size; iVar10 = iVar10 + 1) {
    ppIVar15 = ImVector<ImGuiWindow_*>::operator[](this_00,iVar10);
    pIVar6 = *ppIVar15;
    pIVar6->WasActive = pIVar6->Active;
    pIVar6->Active = false;
    pIVar6->Accessed = false;
  }
  if ((pIVar7->FocusedWindow != (ImGuiWindow *)0x0) && (pIVar7->FocusedWindow->WasActive == false))
  {
    do {
      iVar22 = iVar10;
      if (iVar22 < 1) goto LAB_00119d41;
      iVar10 = iVar22 + -1;
      ppIVar15 = ImVector<ImGuiWindow_*>::operator[](this_00,iVar10);
    } while (((*ppIVar15)->WasActive == false) ||
            (ppIVar15 = ImVector<ImGuiWindow_*>::operator[](this_00,iVar10),
            ((*ppIVar15)->Flags & 0x100000) != 0));
    ImVector<ImGuiWindow_*>::operator[](this_00,iVar22 + -1);
    FocusWindow(in_stack_ffffffffffffff58);
  }
LAB_00119d41:
  iVar22 = 0;
  ImVector<ImGuiWindow_*>::resize(&pIVar7->CurrentWindowStack,0);
  ImVector<ImGuiPopupRef>::resize(&pIVar7->CurrentPopupStack,0);
  pIVar7 = GImGui;
  iVar10 = (GImGui->OpenPopupStack).Size;
  if (iVar10 != 0) {
    this_01 = &GImGui->OpenPopupStack;
    if (GImGui->FocusedWindow != (ImGuiWindow *)0x0) {
      for (iVar22 = 0; iVar22 < iVar10; iVar22 = iVar22 + 1) {
        pvVar16 = ImVector<ImGuiPopupRef>::operator[](this_01,iVar22);
        if (pvVar16->Window != (ImGuiWindow *)0x0) {
          uVar28 = pvVar16->Window->Flags;
          if ((uVar28 >> 0x19 & 1) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                          ,0xd42,"void CloseInactivePopups()");
          }
          if ((uVar28 >> 0x14 & 1) == 0) {
            bVar27 = false;
            i_00 = iVar22;
            while ((iVar10 = this_01->Size, i_00 < iVar10 && (!bVar27))) {
              pvVar16 = ImVector<ImGuiPopupRef>::operator[](this_01,i_00);
              if (pvVar16->Window == (ImGuiWindow *)0x0) {
                bVar27 = false;
              }
              else {
                pvVar16 = ImVector<ImGuiPopupRef>::operator[](this_01,i_00);
                bVar27 = pvVar16->Window->RootWindow == pIVar7->FocusedWindow->RootWindow;
              }
              i_00 = i_00 + 1;
            }
            if (!bVar27) break;
          }
        }
        iVar10 = this_01->Size;
      }
    }
    if (iVar22 < iVar10) {
      ImVector<ImGuiPopupRef>::resize(this_01,iVar22);
    }
  }
  pIVar7 = GImGui;
  (pIVar7->SetNextWindowSizeVal).x = 400.0;
  (pIVar7->SetNextWindowSizeVal).y = 400.0;
  pIVar7->SetNextWindowSizeCond = 4;
  Begin("Debug",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    ImGuiContext& g = *GImGui;

    // Check user data
    IM_ASSERT(g.IO.DeltaTime >= 0.0f);               // Need a positive DeltaTime (zero is tolerated but will cause some timing issues)
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f);
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0);           // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded());     // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f);  // Invalid style setting

    if (!g.Initialized)
    {
        // Initialize on first frame
        g.LogClipboard = (ImGuiTextBuffer*)ImGui::MemAlloc(sizeof(ImGuiTextBuffer));
        IM_PLACEMENT_NEW(g.LogClipboard) ImGuiTextBuffer();

        IM_ASSERT(g.Settings.empty());
        LoadSettings();
        g.Initialized = true;
    }

    SetCurrentFont(g.IO.Fonts->Fonts[0]);

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.Tooltip[0] = '\0';
    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.RenderDrawData.Valid = false;
    g.RenderDrawData.CmdLists = NULL;
    g.RenderDrawData.CmdListsCount = g.RenderDrawData.TotalVtxCount = g.RenderDrawData.TotalIdxCount = 0;

    // Update inputs state
    if (g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0)
        g.IO.MousePos = ImVec2(-9999.0f, -9999.0f);
    if ((g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0) || (g.IO.MousePosPrev.x < 0 && g.IO.MousePosPrev.y < 0))   // if mouse just appeared or disappeared (negative coordinate) we cancel out movement in MouseDelta
        g.IO.MouseDelta = ImVec2(0.0f, 0.0f);
    else
        g.IO.MouseDelta = g.IO.MousePos - g.IO.MousePosPrev;
    g.IO.MousePosPrev = g.IO.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        g.IO.MouseClicked[i] = g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] < 0.0f;
        g.IO.MouseReleased[i] = !g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] >= 0.0f;
        g.IO.MouseDownDurationPrev[i] = g.IO.MouseDownDuration[i];
        g.IO.MouseDownDuration[i] = g.IO.MouseDown[i] ? (g.IO.MouseDownDuration[i] < 0.0f ? 0.0f : g.IO.MouseDownDuration[i] + g.IO.DeltaTime) : -1.0f;
        g.IO.MouseDoubleClicked[i] = false;
        if (g.IO.MouseClicked[i])
        {
            if (g.Time - g.IO.MouseClickedTime[i] < g.IO.MouseDoubleClickTime)
            {
                if (ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]) < g.IO.MouseDoubleClickMaxDist * g.IO.MouseDoubleClickMaxDist)
                    g.IO.MouseDoubleClicked[i] = true;
                g.IO.MouseClickedTime[i] = -FLT_MAX;    // so the third click isn't turned into a double-click
            }
            else
            {
                g.IO.MouseClickedTime[i] = g.Time;
            }
            g.IO.MouseClickedPos[i] = g.IO.MousePos;
            g.IO.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (g.IO.MouseDown[i])
        {
            g.IO.MouseDragMaxDistanceSqr[i] = ImMax(g.IO.MouseDragMaxDistanceSqr[i], ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]));
        }
    }
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = 1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame));

    // Clear reference to active widget if the widget isn't alive anymore
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        SetActiveID(0);
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;

    // Handle user moving window (at the beginning of the frame to avoid input lag or sheering). Only valid for root windows.
    if (g.MovedWindowMoveId && g.MovedWindowMoveId == g.ActiveId)
    {
        KeepAliveID(g.MovedWindowMoveId);
        IM_ASSERT(g.MovedWindow && g.MovedWindow->RootWindow);
        IM_ASSERT(g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId);
        if (g.IO.MouseDown[0])
        {
            if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoMove))
            {
                g.MovedWindow->PosFloat += g.IO.MouseDelta;
                if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoSavedSettings))
                    MarkSettingsDirty();
            }
            FocusWindow(g.MovedWindow);
        }
        else
        {
            SetActiveID(0);
            g.MovedWindow = NULL;
            g.MovedWindowMoveId = 0;
        }
    }
    else
    {
        g.MovedWindow = NULL;
        g.MovedWindowMoveId = 0;
    }

    // Delay saving settings so we don't spam disk too much
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveSettings();
    }

    // Find the window we are hovering. Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow
    g.HoveredWindow = g.MovedWindow ? g.MovedWindow : FindHoveredWindow(g.IO.MousePos, false);
    if (g.HoveredWindow && (g.HoveredWindow->Flags & ImGuiWindowFlags_ChildWindow))
        g.HoveredRootWindow = g.HoveredWindow->RootWindow;
    else
        g.HoveredRootWindow = g.MovedWindow ? g.MovedWindow->RootWindow : FindHoveredWindow(g.IO.MousePos, true);

    if (ImGuiWindow* modal_window = GetFrontMostModalRootWindow())
    {
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
        ImGuiWindow* window = g.HoveredRootWindow;
        while (window && window != modal_window)
            window = window->ParentWindow;
        if (!window)
            g.HoveredRootWindow = g.HoveredWindow = NULL;
    }
    else
    {
        g.ModalWindowDarkeningRatio = 0.0f;
    }

    // Are we using inputs? Tell user so they can capture/discard the inputs away from the rest of their application.
    // When clicking outside of a window we assume the click is owned by the application and won't request capture. We need to track click ownership.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[mouse_earliest_button_down] > g.IO.MouseClickedTime[i])
                mouse_earliest_button_down = i;
    }
    bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];
    if (g.CaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.CaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.ActiveId != 0) || (!g.OpenPopupStack.empty());
    g.IO.WantCaptureKeyboard = (g.CaptureKeyboardNextFrame != -1) ? (g.CaptureKeyboardNextFrame != 0) : (g.ActiveId != 0);
    g.IO.WantTextInput = (g.ActiveId != 0 && g.InputTextState.Id == g.ActiveId);
    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.CaptureMouseNextFrame = g.CaptureKeyboardNextFrame = -1;
    g.OsImePosRequest = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    if (!mouse_avail_to_imgui)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Scale & Scrolling
    if (g.HoveredWindow && g.IO.MouseWheel != 0.0f && !g.HoveredWindow->Collapsed)
    {
        ImGuiWindow* window = g.HoveredWindow;
        if (g.IO.KeyCtrl)
        {
            if (g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->PosFloat += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
        }
        else if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
        {
            // Scroll
            const int scroll_lines = (window->Flags & ImGuiWindowFlags_ComboBox) ? 3 : 5;
            SetWindowScrollY(window, window->Scroll.y - g.IO.MouseWheel * window->CalcFontSize() * scroll_lines);
        }
    }

    // Pressing TAB activate widget focus
    // NB: Don't discard FocusedWindow if it isn't active, so that a window that go on/off programatically won't lose its keyboard focus.
    if (g.ActiveId == 0 && g.FocusedWindow != NULL && g.FocusedWindow->Active && IsKeyPressedMap(ImGuiKey_Tab, false))
        g.FocusedWindow->FocusIdxTabRequestNext = 0;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->Accessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.FocusedWindow && !g.FocusedWindow->WasActive)
        for (int i = g.Windows.Size-1; i >= 0; i--)
            if (g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
            {
                FocusWindow(g.Windows[i]);
                break;
            }

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    CloseInactivePopups();

    // Create implicit window - we will only render it if the user has added something to it.
    ImGui::SetNextWindowSize(ImVec2(400,400), ImGuiSetCond_FirstUseEver);
    ImGui::Begin("Debug");
}